

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall QWidgetTextControlPrivate::isPreediting(QWidgetTextControlPrivate *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QTextLayout *layout;
  byte local_4a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::block();
  lVar3 = QTextBlock::layout();
  local_4a = 0;
  if (lVar3 != 0) {
    QTextLayout::preeditAreaText();
    bVar2 = QString::isEmpty((QString *)0x71a374);
    local_4a = bVar2 ^ 0xff;
    QString::~QString((QString *)0x71a395);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (local_4a & 1) != 0;
}

Assistant:

bool QWidgetTextControlPrivate::isPreediting() const
{
    QTextLayout *layout = cursor.block().layout();
    if (layout && !layout->preeditAreaText().isEmpty())
        return true;

    return false;
}